

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_3dPoint::operator>=(ON_3dPoint *this,ON_3dPoint *p)

{
  byte local_24;
  bool local_23;
  byte local_22;
  byte local_21;
  ON_3dPoint *p_local;
  ON_3dPoint *this_local;
  
  if (this->x < p->x || this->x == p->x) {
    if ((this->x != p->x) || (NAN(this->x) || NAN(p->x))) {
      local_24 = 0;
    }
    else {
      if (this->y < p->y || this->y == p->y) {
        local_23 = false;
        if ((this->y == p->y) && (!NAN(this->y) && !NAN(p->y))) {
          local_23 = p->z <= this->z;
        }
        local_22 = -local_23;
      }
      else {
        local_22 = 1;
      }
      local_24 = local_22;
    }
    local_21 = local_24;
  }
  else {
    local_21 = 1;
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool ON_3dPoint::operator>=( const ON_3dPoint& p ) const
{
  // dictionary order
  return ((x>p.x)?true:((x==p.x)?((y>p.y)?true:(y==p.y&&z>=p.z)?true:false):false));
}